

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::Picker::_q_rowsInserted(Picker *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  QModelIndex *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  PickerPrivate *pPVar5;
  ulong uVar6;
  bool local_81;
  QModelIndex local_80;
  QModelIndex local_68;
  QModelIndex local_50;
  QModelIndex local_38;
  int local_20;
  int local_1c;
  int end_local;
  int start_local;
  QModelIndex *parent_local;
  Picker *this_local;
  
  local_20 = end;
  local_1c = start;
  _end_local = parent;
  parent_local = (QModelIndex *)this;
  pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  this_00 = _end_local;
  local_81 = true;
  if ((pPVar5->inserting & 1U) == 0) {
    pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_38,&pPVar5->root);
    local_81 = QModelIndex::operator!=(this_00,&local_38);
  }
  if (local_81 == false) {
    if ((local_1c == 0) && (iVar3 = local_20 + 1, iVar4 = count(this), iVar3 == iVar4)) {
      QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
      operator->(&this->d);
      uVar6 = QPersistentModelIndex::isValid();
      if ((uVar6 & 1) == 0) {
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        pQVar1 = pPVar5->model;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar3 = pPVar5->modelColumn;
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_68,&pPVar5->root);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_50,pQVar1,0,iVar3,&local_68);
        pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator=(&pPVar5->topItemIndex,&local_50);
        setCurrentIndex(this,0);
        return;
      }
    }
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    iVar3 = QPersistentModelIndex::row();
    pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    if (iVar3 == pPVar5->indexBeforeChange) {
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      bVar2 = PickerPrivate::isRowsVisible(pPVar5,local_1c,local_20);
      if (bVar2) {
        QWidget::update();
      }
    }
    else {
      QWidget::update();
      pPVar5 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&pPVar5->currentIndex);
      _q_emitCurrentIndexChanged(this,&local_80);
    }
  }
  return;
}

Assistant:

void
Picker::_q_rowsInserted( const QModelIndex & parent, int start, int end )
{
	if( d->inserting || parent != d->root )
		return;

	// set current index if picker was previously empty
	if( start == 0 && ( end - start + 1 ) == count() &&
		!d->currentIndex.isValid() )
	{
		d->topItemIndex = d->model->index( 0, d->modelColumn, d->root );
		setCurrentIndex( 0 );
	}
	// need to emit changed if model updated index "silently"
	else if( d->currentIndex.row() != d->indexBeforeChange )
	{
		update();
		_q_emitCurrentIndexChanged( d->currentIndex );
	}
	else if( d->isRowsVisible( start, end ) )
		update();
}